

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O3

void u_releaseDefaultConverter_63(UConverter *converter)

{
  UConverter *converter_00;
  
  converter_00 = converter;
  if (gDefaultConverter == (UConverter *)0x0) {
    if (converter != (UConverter *)0x0) {
      ucnv_reset_63(converter);
    }
    ucnv_enableCleanup_63();
    umtx_lock_63((UMutex *)0x0);
    if (gDefaultConverter == (UConverter *)0x0) {
      converter_00 = (UConverter *)0x0;
      gDefaultConverter = converter;
    }
    umtx_unlock_63((UMutex *)0x0);
  }
  if (converter_00 != (UConverter *)0x0) {
    ucnv_close_63(converter_00);
    return;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_releaseDefaultConverter(UConverter *converter)
{
    if(gDefaultConverter == NULL) {
        if (converter != NULL) {
            ucnv_reset(converter);
        }
        ucnv_enableCleanup();
        umtx_lock(NULL);
        if(gDefaultConverter == NULL) {
            gDefaultConverter = converter;
            converter = NULL;
        }
        umtx_unlock(NULL);
    }

    if(converter != NULL) {
        ucnv_close(converter);
    }
}